

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O1

string * __thiscall
QPDFExc::createWhat(string *__return_storage_ptr__,QPDFExc *this,string *filename,string *object,
                   qpdf_offset_t offset,string *message)

{
  bool bVar1;
  uint uVar2;
  long *plVar3;
  string *psVar4;
  long *plVar5;
  uint __len;
  unsigned_long_long __uval;
  string __str;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)&this->field_0x8 != 0) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)this);
  }
  if ((-1 < (long)object) || (filename->_M_string_length != 0)) {
    if (*(long *)&this->field_0x8 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (filename->_M_string_length != 0) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(filename->_M_dataplus)._M_p);
      if (-1 < (long)object) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    if (-1 < (long)object) {
      __len = 1;
      if ((string *)0x9 < object) {
        psVar4 = object;
        uVar2 = 4;
        do {
          __len = uVar2;
          if (psVar4 < (string *)0x64) {
            __len = __len - 2;
            goto LAB_0016766c;
          }
          if (psVar4 < (string *)0x3e8) {
            __len = __len - 1;
            goto LAB_0016766c;
          }
          if (psVar4 < (string *)0x2710) goto LAB_0016766c;
          bVar1 = (string *)0x1869f < psVar4;
          psVar4 = (string *)((ulong)psVar4 / 10000);
          uVar2 = __len + 4;
        } while (bVar1);
        __len = __len + 1;
      }
LAB_0016766c:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)local_50[0],__len,(unsigned_long_long)object);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x282e9b);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    if (*(long *)&this->field_0x8 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)offset);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFExc::createWhat(
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message)
{
    std::string result;
    if (!filename.empty()) {
        result += filename;
    }
    if (!(object.empty() && offset < 0)) {
        if (!filename.empty()) {
            result += " (";
        }
        if (!object.empty()) {
            result += object;
            if (offset >= 0) {
                result += ", ";
            }
        }
        if (offset >= 0) {
            result += "offset " + std::to_string(offset);
        }
        if (!filename.empty()) {
            result += ")";
        }
    }
    if (!result.empty()) {
        result += ": ";
    }
    result += message;
    return result;
}